

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Array<double,_1,1,0,_1,1>const,_1,1,false>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,1,0,_1,1>const>const>,Eigen::internal::assign_op<double,double>>
               (Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                *dst,CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<const_Eigen::Array<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
                     *src,assign_op<double,_double> *func)

{
  undefined8 func_00;
  Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_> *dstExpr;
  undefined1 local_a0 [8];
  Kernel kernel;
  DstEvaluatorType dstEvaluator;
  undefined1 local_58 [8];
  SrcEvaluatorType srcEvaluator;
  assign_op<double,_double> *func_local;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<const_Eigen::Array<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
  *src_local;
  Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_> *dst_local;
  
  srcEvaluator.
  super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<const_Eigen::Array<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
  .m_d.rhsImpl.
  super_evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
  ._8_8_ = func;
  evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<const_Eigen::Array<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_-1,_1,_0,_-1,_1>_>_>_>
  ::evaluator((evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<const_Eigen::Array<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>_>
               *)local_58,src);
  resize_if_allowed<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Array<double,_1,1,0,_1,1>const,_1,1,false>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,1,0,_1,1>const>const>,double,double>
            (dst,src,(assign_op<double,_double> *)
                     srcEvaluator.
                     super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<const_Eigen::Array<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                     .m_d.rhsImpl.
                     super_evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
                     ._8_8_);
  evaluator<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>_>
  ::evaluator((evaluator<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
               *)&kernel.m_dstExpr,dst);
  func_00 = srcEvaluator.
            super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<const_Eigen::Array<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
            .m_d.rhsImpl.
            super_evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
            ._8_8_;
  dstExpr = EigenBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>_>
            ::const_cast_derived
                      ((EigenBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
                        *)dst);
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<const_Eigen::Array<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_-1,_1,_0,_-1,_1>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
  ::generic_dense_assignment_kernel
            ((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<const_Eigen::Array<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
              *)local_a0,(DstEvaluatorType *)&kernel.m_dstExpr,(SrcEvaluatorType *)local_58,
             (assign_op<double,_double> *)func_00,dstExpr);
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<const_Eigen::Array<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_-1,_1,_0,_-1,_1>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_1,_0>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<const_Eigen::Array<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
         *)local_a0);
  evaluator<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>_>
  ::~evaluator((evaluator<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
                *)&kernel.m_dstExpr);
  evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<const_Eigen::Array<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_-1,_1,_0,_-1,_1>_>_>_>
  ::~evaluator((evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<const_Eigen::Array<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>_>
                *)local_58);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);

  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}